

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

PrimMeta * tinyusdz::anon_unknown_237::GetPrimMeta(Value *v)

{
  Model *pMVar1;
  Scope *pSVar2;
  Xform *pXVar3;
  GPrim *pGVar4;
  GeomMesh *pGVar5;
  GeomPoints *pGVar6;
  GeomCube *pGVar7;
  GeomCapsule *pGVar8;
  GeomCylinder *pGVar9;
  GeomSphere *pGVar10;
  GeomCone *pGVar11;
  GeomSubset *pGVar12;
  GeomCamera *pGVar13;
  GeomBasisCurves *pGVar14;
  DomeLight *pDVar15;
  SphereLight *pSVar16;
  CylinderLight *pCVar17;
  DiskLight *pDVar18;
  RectLight *pRVar19;
  Material *pMVar20;
  Shader *pSVar21;
  SkelRoot *pSVar22;
  Skeleton *pSVar23;
  SkelAnimation *pSVar24;
  BlendShape *pBVar25;
  Value *v_local;
  
  pMVar1 = tinyusdz::value::Value::as<tinyusdz::Model>(v,false);
  if (pMVar1 == (Model *)0x0) {
    pSVar2 = tinyusdz::value::Value::as<tinyusdz::Scope>(v,false);
    if (pSVar2 == (Scope *)0x0) {
      pXVar3 = tinyusdz::value::Value::as<tinyusdz::Xform>(v,false);
      if (pXVar3 == (Xform *)0x0) {
        pGVar4 = tinyusdz::value::Value::as<tinyusdz::GPrim>(v,false);
        if (pGVar4 == (GPrim *)0x0) {
          pGVar5 = tinyusdz::value::Value::as<tinyusdz::GeomMesh>(v,false);
          if (pGVar5 == (GeomMesh *)0x0) {
            pGVar6 = tinyusdz::value::Value::as<tinyusdz::GeomPoints>(v,false);
            if (pGVar6 == (GeomPoints *)0x0) {
              pGVar7 = tinyusdz::value::Value::as<tinyusdz::GeomCube>(v,false);
              if (pGVar7 == (GeomCube *)0x0) {
                pGVar8 = tinyusdz::value::Value::as<tinyusdz::GeomCapsule>(v,false);
                if (pGVar8 == (GeomCapsule *)0x0) {
                  pGVar9 = tinyusdz::value::Value::as<tinyusdz::GeomCylinder>(v,false);
                  if (pGVar9 == (GeomCylinder *)0x0) {
                    pGVar10 = tinyusdz::value::Value::as<tinyusdz::GeomSphere>(v,false);
                    if (pGVar10 == (GeomSphere *)0x0) {
                      pGVar11 = tinyusdz::value::Value::as<tinyusdz::GeomCone>(v,false);
                      if (pGVar11 == (GeomCone *)0x0) {
                        pGVar12 = tinyusdz::value::Value::as<tinyusdz::GeomSubset>(v,false);
                        if (pGVar12 == (GeomSubset *)0x0) {
                          pGVar13 = tinyusdz::value::Value::as<tinyusdz::GeomCamera>(v,false);
                          if (pGVar13 == (GeomCamera *)0x0) {
                            pGVar14 = tinyusdz::value::Value::as<tinyusdz::GeomBasisCurves>(v,false)
                            ;
                            if (pGVar14 == (GeomBasisCurves *)0x0) {
                              pDVar15 = tinyusdz::value::Value::as<tinyusdz::DomeLight>(v,false);
                              if (pDVar15 == (DomeLight *)0x0) {
                                pSVar16 = tinyusdz::value::Value::as<tinyusdz::SphereLight>(v,false)
                                ;
                                if (pSVar16 == (SphereLight *)0x0) {
                                  pCVar17 = tinyusdz::value::Value::as<tinyusdz::CylinderLight>
                                                      (v,false);
                                  if (pCVar17 == (CylinderLight *)0x0) {
                                    pDVar18 = tinyusdz::value::Value::as<tinyusdz::DiskLight>
                                                        (v,false);
                                    if (pDVar18 == (DiskLight *)0x0) {
                                      pRVar19 = tinyusdz::value::Value::as<tinyusdz::RectLight>
                                                          (v,false);
                                      if (pRVar19 == (RectLight *)0x0) {
                                        pMVar20 = tinyusdz::value::Value::as<tinyusdz::Material>
                                                            (v,false);
                                        if (pMVar20 == (Material *)0x0) {
                                          pSVar21 = tinyusdz::value::Value::as<tinyusdz::Shader>
                                                              (v,false);
                                          if (pSVar21 == (Shader *)0x0) {
                                            pSVar22 = tinyusdz::value::Value::as<tinyusdz::SkelRoot>
                                                                (v,false);
                                            if (pSVar22 == (SkelRoot *)0x0) {
                                              pSVar23 = tinyusdz::value::Value::
                                                        as<tinyusdz::Skeleton>(v,false);
                                              if (pSVar23 == (Skeleton *)0x0) {
                                                pSVar24 = tinyusdz::value::Value::
                                                          as<tinyusdz::SkelAnimation>(v,false);
                                                if (pSVar24 == (SkelAnimation *)0x0) {
                                                  pBVar25 = tinyusdz::value::Value::
                                                            as<tinyusdz::BlendShape>(v,false);
                                                  if (pBVar25 == (BlendShape *)0x0) {
                                                    v_local = (Value *)0x0;
                                                  }
                                                  else {
                                                    pBVar25 = tinyusdz::value::Value::
                                                              as<tinyusdz::BlendShape>(v,false);
                                                    v_local = (Value *)&pBVar25->meta;
                                                  }
                                                }
                                                else {
                                                  pSVar24 = tinyusdz::value::Value::
                                                            as<tinyusdz::SkelAnimation>(v,false);
                                                  v_local = (Value *)&pSVar24->meta;
                                                }
                                              }
                                              else {
                                                pSVar23 = tinyusdz::value::Value::
                                                          as<tinyusdz::Skeleton>(v,false);
                                                v_local = (Value *)&pSVar23->meta;
                                              }
                                            }
                                            else {
                                              pSVar22 = tinyusdz::value::Value::
                                                        as<tinyusdz::SkelRoot>(v,false);
                                              v_local = (Value *)&pSVar22->meta;
                                            }
                                          }
                                          else {
                                            pSVar21 = tinyusdz::value::Value::as<tinyusdz::Shader>
                                                                (v,false);
                                            v_local = (Value *)&(pSVar21->super_UsdShadePrim).meta;
                                          }
                                        }
                                        else {
                                          pMVar20 = tinyusdz::value::Value::as<tinyusdz::Material>
                                                              (v,false);
                                          v_local = (Value *)&(pMVar20->super_UsdShadePrim).meta;
                                        }
                                      }
                                      else {
                                        pRVar19 = tinyusdz::value::Value::as<tinyusdz::RectLight>
                                                            (v,false);
                                        v_local = (Value *)&(pRVar19->super_BoundableLight).meta;
                                      }
                                    }
                                    else {
                                      pDVar18 = tinyusdz::value::Value::as<tinyusdz::DiskLight>
                                                          (v,false);
                                      v_local = (Value *)&(pDVar18->super_BoundableLight).meta;
                                    }
                                  }
                                  else {
                                    pCVar17 = tinyusdz::value::Value::as<tinyusdz::CylinderLight>
                                                        (v,false);
                                    v_local = (Value *)&(pCVar17->super_BoundableLight).meta;
                                  }
                                }
                                else {
                                  pSVar16 = tinyusdz::value::Value::as<tinyusdz::SphereLight>
                                                      (v,false);
                                  v_local = (Value *)&(pSVar16->super_BoundableLight).meta;
                                }
                              }
                              else {
                                pDVar15 = tinyusdz::value::Value::as<tinyusdz::DomeLight>(v,false);
                                v_local = (Value *)&(pDVar15->super_NonboundableLight).meta;
                              }
                            }
                            else {
                              pGVar14 = tinyusdz::value::Value::as<tinyusdz::GeomBasisCurves>
                                                  (v,false);
                              v_local = (Value *)&(pGVar14->super_GPrim).meta;
                            }
                          }
                          else {
                            pGVar13 = tinyusdz::value::Value::as<tinyusdz::GeomCamera>(v,false);
                            v_local = (Value *)&(pGVar13->super_GPrim).meta;
                          }
                        }
                        else {
                          pGVar12 = tinyusdz::value::Value::as<tinyusdz::GeomSubset>(v,false);
                          v_local = (Value *)&pGVar12->meta;
                        }
                      }
                      else {
                        pGVar11 = tinyusdz::value::Value::as<tinyusdz::GeomCone>(v,false);
                        v_local = (Value *)&(pGVar11->super_GPrim).meta;
                      }
                    }
                    else {
                      pGVar10 = tinyusdz::value::Value::as<tinyusdz::GeomSphere>(v,false);
                      v_local = (Value *)&(pGVar10->super_GPrim).meta;
                    }
                  }
                  else {
                    pGVar9 = tinyusdz::value::Value::as<tinyusdz::GeomCylinder>(v,false);
                    v_local = (Value *)&(pGVar9->super_GPrim).meta;
                  }
                }
                else {
                  pGVar8 = tinyusdz::value::Value::as<tinyusdz::GeomCapsule>(v,false);
                  v_local = (Value *)&(pGVar8->super_GPrim).meta;
                }
              }
              else {
                pGVar7 = tinyusdz::value::Value::as<tinyusdz::GeomCube>(v,false);
                v_local = (Value *)&(pGVar7->super_GPrim).meta;
              }
            }
            else {
              pGVar6 = tinyusdz::value::Value::as<tinyusdz::GeomPoints>(v,false);
              v_local = (Value *)&(pGVar6->super_GPrim).meta;
            }
          }
          else {
            pGVar5 = tinyusdz::value::Value::as<tinyusdz::GeomMesh>(v,false);
            v_local = (Value *)&(pGVar5->super_GPrim).meta;
          }
        }
        else {
          pGVar4 = tinyusdz::value::Value::as<tinyusdz::GPrim>(v,false);
          v_local = (Value *)&pGVar4->meta;
        }
      }
      else {
        pXVar3 = tinyusdz::value::Value::as<tinyusdz::Xform>(v,false);
        v_local = (Value *)&(pXVar3->super_GPrim).meta;
      }
    }
    else {
      pSVar2 = tinyusdz::value::Value::as<tinyusdz::Scope>(v,false);
      v_local = (Value *)&pSVar2->meta;
    }
  }
  else {
    pMVar1 = tinyusdz::value::Value::as<tinyusdz::Model>(v,false);
    v_local = (Value *)&pMVar1->meta;
  }
  return (PrimMeta *)v_local;
}

Assistant:

PrimMeta *GetPrimMeta(value::Value &v) {
  // Lookup PrimMeta variable in Prim class

#define GET_PRIM_META(__ty)       \
  if (v.as<__ty>()) {             \
    return &(v.as<__ty>()->meta); \
  }

  GET_PRIM_META(Model)
  GET_PRIM_META(Scope)
  GET_PRIM_META(Xform)
  GET_PRIM_META(GPrim)
  GET_PRIM_META(GeomMesh)
  GET_PRIM_META(GeomPoints)
  GET_PRIM_META(GeomCube)
  GET_PRIM_META(GeomCapsule)
  GET_PRIM_META(GeomCylinder)
  GET_PRIM_META(GeomSphere)
  GET_PRIM_META(GeomCone)
  GET_PRIM_META(GeomSubset)
  GET_PRIM_META(GeomCamera)
  GET_PRIM_META(GeomBasisCurves)
  GET_PRIM_META(DomeLight)
  GET_PRIM_META(SphereLight)
  GET_PRIM_META(CylinderLight)
  GET_PRIM_META(DiskLight)
  GET_PRIM_META(RectLight)
  GET_PRIM_META(Material)
  GET_PRIM_META(Shader)
  // GET_PRIM_META(UsdPreviewSurface)
  // GET_PRIM_META(UsdUVTexture)
  // GET_PRIM_META(UsdPrimvarReader_int)
  // GET_PRIM_META(UsdPrimvarReader_float)
  // GET_PRIM_META(UsdPrimvarReader_float2)
  // GET_PRIM_META(UsdPrimvarReader_float3)
  // GET_PRIM_META(UsdPrimvarReader_float4)
  GET_PRIM_META(SkelRoot)
  GET_PRIM_META(Skeleton)
  GET_PRIM_META(SkelAnimation)
  GET_PRIM_META(BlendShape)

#undef GET_PRIM_META

  return nullptr;
}